

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * parse_boolean_value(char **string)

{
  int iVar1;
  long *in_RDI;
  size_t false_token_size;
  size_t true_token_size;
  int in_stack_ffffffffffffffdc;
  JSON_Value *local_8;
  
  iVar1 = strncmp("true",(char *)*in_RDI,4);
  if (iVar1 == 0) {
    *in_RDI = *in_RDI + 4;
    local_8 = json_value_init_boolean(in_stack_ffffffffffffffdc);
  }
  else {
    iVar1 = strncmp("false",(char *)*in_RDI,5);
    if (iVar1 == 0) {
      *in_RDI = *in_RDI + 5;
      local_8 = json_value_init_boolean(in_stack_ffffffffffffffdc);
    }
    else {
      local_8 = (JSON_Value *)0x0;
    }
  }
  return local_8;
}

Assistant:

static JSON_Value * parse_boolean_value(const char **string) {
    size_t true_token_size = SIZEOF_TOKEN("true");
    size_t false_token_size = SIZEOF_TOKEN("false");
    if (strncmp("true", *string, true_token_size) == 0) {
        *string += true_token_size;
        return json_value_init_boolean(1);
    } else if (strncmp("false", *string, false_token_size) == 0) {
        *string += false_token_size;
        return json_value_init_boolean(0);
    }
    return NULL;
}